

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O0

vector<duckdb::LogicalType,_true> *
duckdb::AggregateFunctionExtractor::GetParameterLogicalTypes
          (AggregateFunctionCatalogEntry *entry,idx_t offset)

{
  AggregateFunction *in_RDI;
  AggregateFunction fun;
  AggregateFunction *this;
  FunctionSet<duckdb::AggregateFunction> *in_stack_fffffffffffffea8;
  
  this = in_RDI;
  FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
            (in_stack_fffffffffffffea8,(idx_t)in_RDI);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)this,(vector<duckdb::LogicalType,_true> *)in_RDI);
  AggregateFunction::~AggregateFunction(this);
  return (vector<duckdb::LogicalType,_true> *)in_RDI;
}

Assistant:

static vector<LogicalType> GetParameterLogicalTypes(AggregateFunctionCatalogEntry &entry, idx_t offset) {
		auto fun = entry.functions.GetFunctionByOffset(offset);
		return fun.arguments;
	}